

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall
llvm::yaml::Scanner::saveSimpleKeyCandidate
          (Scanner *this,iterator Tok,uint AtColumn,bool IsRequired)

{
  undefined8 uVar1;
  void *pvVar2;
  uint uVar3;
  long lVar4;
  
  if (this->IsSimpleKeyAllowed == true) {
    uVar1 = *(undefined8 *)&this->Line;
    uVar3 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
            super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
            super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
            super_SmallVectorBase.Size;
    if ((this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
        super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
        super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
        super_SmallVectorBase.Capacity <= uVar3) {
      SmallVectorBase::grow_pod
                ((SmallVectorBase *)&this->SimpleKeys,
                 &(this->SimpleKeys).super_SmallVectorStorage<(anonymous_namespace)::SimpleKey,_4U>,
                 0,0x18);
      uVar3 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
              super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
              super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
              super_SmallVectorBase.Size;
    }
    pvVar2 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX;
    lVar4 = (ulong)uVar3 * 0x18;
    ((iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
      *)((long)pvVar2 + lVar4))->I =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )Tok.
           super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
           .I.NodePtr;
    *(uint *)((long)pvVar2 + lVar4 + 8) = AtColumn;
    *(undefined8 *)((long)pvVar2 + lVar4 + 0xc) = uVar1;
    *(bool *)((long)pvVar2 + lVar4 + 0x14) = IsRequired;
    SmallVectorBase::set_size
              ((SmallVectorBase *)&this->SimpleKeys,
               (ulong)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                      super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                      super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                      super_SmallVectorBase.Size + 1);
    return;
  }
  return;
}

Assistant:

void Scanner::saveSimpleKeyCandidate( TokenQueueT::iterator Tok
                                    , unsigned AtColumn
                                    , bool IsRequired) {
  if (IsSimpleKeyAllowed) {
    SimpleKey SK;
    SK.Tok = Tok;
    SK.Line = Line;
    SK.Column = AtColumn;
    SK.IsRequired = IsRequired;
    SK.FlowLevel = FlowLevel;
    SimpleKeys.push_back(SK);
  }
}